

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.hpp
# Opt level: O3

uint __thiscall rek::sample::AliasSampler::walkerSample(AliasSampler *this)

{
  double *pdVar1;
  uint uVar2;
  double dVar3;
  
  uVar2 = this->N;
  dVar3 = drand48();
  uVar2 = (uint)(long)(dVar3 * (double)(uVar2 - 1));
  dVar3 = drand48();
  pdVar1 = (this->Y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + (uVar2 + 1);
  if (*pdVar1 <= dVar3 && dVar3 != *pdVar1) {
    uVar2 = (this->A).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar2 + 1] - 1;
  }
  return uVar2;
}

Assistant:

unsigned int walkerSample() {
    unsigned int i;
    double r;
    /* Let i = random uniform integer from {1,2,...N};  */
    i = 1 + (unsigned int)((N - 1) * drand48());
    r = drand48();
    if (r > Y[i]) i = A[i];

    return i - 1;
  }